

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O1

void __thiscall
FrobTadsApplicationCurses::scrollRegionUp
          (FrobTadsApplicationCurses *this,int top,int left,int bottom,int right,int attrs)

{
  chtype ch;
  int i;
  int x;
  
  if (top < bottom) {
    do {
      if (left <= right) {
        x = left;
        do {
          ch = FrobTadsWindow::charAt
                         ((this->fGameWindow)._M_t.
                          super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>
                          .super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl,bottom + -1,x
                         );
          FrobTadsWindow::printChar
                    ((this->fGameWindow)._M_t.
                     super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
                     super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl,bottom,x,ch);
          x = x + 1;
        } while (right + 1 != x);
      }
      bottom = bottom + -1;
    } while (top < bottom);
  }
  if (left <= right) {
    do {
      FrobTadsWindow::printChar
                ((this->fGameWindow)._M_t.
                 super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
                 super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
                 super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl,top,left,attrs | 0x20);
      left = left + 1;
    } while (right + 1 != left);
  }
  if ((this->super_FrobTadsApplication).options.softScroll != false) {
    wrefresh(((_Head_base<0UL,__win_st_*,_false> *)
             ((long)&(((this->fGameWindow)._M_t.
                       super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>
                       .super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl)->fWin)._M_t + 8
             ))->_M_head_impl);
    return;
  }
  return;
}

Assistant:

void
FrobTadsApplicationCurses::scrollRegionUp( int top, int left, int bottom, int right, int attrs )
{
    // Old curses versions might break when using overlapping
    // windows, so we do the scrolling by hand.
    for (int y = bottom; y > top; --y) {
        for (int x = left; x <= right; ++x) {
            const chtype c = this->fGameWindow->charAt(y-1, x);
            this->fGameWindow->printChar(y, x, c);
        }
    }

    // Clear the last line.
    const chtype c = attrs | ' ';
    for (int i = left; i <= right; ++i) this->fGameWindow->printChar(top, i, c);

    // If soft-scrolling is enabled, update the display so that we
    // have a visible scrolling-effect.
    if (this->options.softScroll) this->fGameWindow->flush();
}